

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

type __thiscall llvm::StringRef::getAsInteger<int>(StringRef *this,uint Radix,int *Result)

{
  bool bVar1;
  type tVar2;
  longlong *in_R8;
  StringRef Str;
  longlong LLVal;
  long local_10;
  
  Str.Length._0_4_ = Radix;
  Str.Data = (char *)this->Length;
  Str.Length._4_4_ = 0;
  bVar1 = getAsSignedInteger((llvm *)this->Data,Str,(uint)&local_10,in_R8);
  tVar2 = true;
  if ((!bVar1) && ((int)local_10 == local_10)) {
    *Result = (int)local_10;
    tVar2 = false;
  }
  return tVar2;
}

Assistant:

typename std::enable_if<std::numeric_limits<T>::is_signed, bool>::type
    getAsInteger(unsigned Radix, T &Result) const {
      long long LLVal;
      if (getAsSignedInteger(*this, Radix, LLVal) ||
            static_cast<T>(LLVal) != LLVal)
        return true;
      Result = LLVal;
      return false;
    }